

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

int mvalue(int N)

{
  int iVar1;
  undefined4 local_10;
  int mval;
  int N_local;
  
  iVar1 = N;
  if (10 < N) {
    if ((N < 0xb) || (0x14 < N)) {
      if ((N < 0x15) || (200 < N)) {
        iVar1 = local_10;
        if (200 < N) {
          local_10 = 0x14;
          iVar1 = local_10;
        }
      }
      else {
        local_10 = 0xf;
        iVar1 = local_10;
      }
    }
    else {
      local_10 = 10;
      iVar1 = local_10;
    }
  }
  local_10 = iVar1;
  return local_10;
}

Assistant:

static int mvalue(int N) {
	int mval;

	if (N <= 10) {
		mval = N;
	} else if (N > 10 && N <= 20) {
		mval = 10;
	} else if (N > 20 && N <= 200) {
		mval = 15;
	} else if ( N > 200) {
		mval = 20;
	}

	return mval;
}